

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Arena *pAVar3;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var4;
  LogMessage *pLVar5;
  _Base_ptr p_Var6;
  _Base_ptr elem;
  _Rb_tree_color _Var7;
  _Base_ptr p_Var8;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  local_58.filename_ = (char *)0x0;
  local_58.line_ = 0;
  local_58._20_4_ = 0;
  local_58.message_._M_dataplus._M_p = (pointer)0x0;
  local_58.level_ = number;
  pVar9 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_58);
  _Var4 = pVar9.first._M_node;
  _Var4._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var4._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    bVar1 = *(byte *)&_Var4._M_node[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
  }
  else {
    *(FieldType *)&_Var4._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x211);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 1) = 1;
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 3) = 0;
    pAVar3 = this->arena_;
    if (pAVar3 == (Arena *)0x0) {
      p_Var6 = (_Base_ptr)operator_new(0x18);
      *(undefined8 *)p_Var6 = 0;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = (_Base_ptr)
               Arena::AllocateAligned
                         (pAVar3,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18
                         );
      *(Arena **)p_Var6 = pAVar3;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
      Arena::AddListNode(pAVar3,p_Var6,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        );
    }
    _Var4._M_node[1]._M_parent = p_Var6;
  }
  p_Var6 = _Var4._M_node[1]._M_parent;
  p_Var8 = p_Var6->_M_left;
  if (p_Var8 == (_Base_ptr)0x0) {
    _Var7 = *(int *)((long)&p_Var6->_M_parent + 4);
  }
  else {
    iVar2 = *(int *)&p_Var6->_M_parent;
    _Var7 = p_Var8->_M_color;
    if (iVar2 < (int)_Var7) {
      *(int *)&p_Var6->_M_parent = iVar2 + 1;
      return (string *)(&p_Var8->_M_parent)[iVar2];
    }
    if (_Var7 != *(int *)((long)&p_Var6->_M_parent + 4)) goto LAB_0034568f;
  }
  RepeatedPtrFieldBase::Reserve((RepeatedPtrFieldBase *)p_Var6,_Var7 + _S_black);
  p_Var8 = p_Var6->_M_left;
  _Var7 = p_Var8->_M_color;
LAB_0034568f:
  p_Var8->_M_color = _Var7 + _S_black;
  pAVar3 = *(Arena **)p_Var6;
  if (pAVar3 == (Arena *)0x0) {
    elem = (_Base_ptr)operator_new(0x20);
    ((_Alloc_hider *)&elem->_M_color)->_M_p = (pointer)&elem->_M_left;
    elem->_M_parent = (_Base_ptr)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&elem->_M_left)->_M_local_buf[0] = '\0';
  }
  else {
    elem = (_Base_ptr)
           Arena::AllocateAligned(pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    ((_Alloc_hider *)&elem->_M_color)->_M_p = (pointer)&elem->_M_left;
    elem->_M_parent = (_Base_ptr)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&elem->_M_left)->_M_local_buf[0] = '\0';
    Arena::AddListNode(pAVar3,elem,arena_destruct_object<std::__cxx11::string>);
    p_Var8 = p_Var6->_M_left;
  }
  iVar2 = *(int *)&p_Var6->_M_parent;
  *(int *)&p_Var6->_M_parent = iVar2 + 1;
  (&p_Var8->_M_parent)[iVar2] = elem;
  return (string *)elem;
}

Assistant:

string* ExtensionSet::AddString(int number, FieldType type,
                                const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<string> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, STRING);
  }
  return extension->repeated_string_value->Add();
}